

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list2cpp.cpp
# Opt level: O0

void __thiscall lst::OutputList::outputToFileAsChar(OutputList *this,ostream *file,string *varname)

{
  ostream *poVar1;
  size_t sVar2;
  reference pvVar3;
  ulong local_28;
  size_t i;
  string *varname_local;
  ostream *file_local;
  OutputList *this_local;
  
  poVar1 = std::operator<<(file,"inline constexpr unsigned long ");
  poVar1 = std::operator<<(poVar1,(string *)varname);
  poVar1 = std::operator<<(poVar1,"_size = ");
  sVar2 = size(this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
  std::operator<<(poVar1,";\n");
  poVar1 = std::operator<<(file,"\ninline const char *");
  poVar1 = std::operator<<(poVar1,(string *)varname);
  poVar1 = std::operator<<(poVar1,"_arr[");
  poVar1 = std::operator<<(poVar1,(string *)varname);
  std::operator<<(poVar1,"_size] = {\n");
  local_28 = 0;
  while( true ) {
    sVar2 = size(this);
    if (sVar2 <= local_28) break;
    sVar2 = size(this);
    if (sVar2 - 2 < local_28) {
      poVar1 = std::operator<<(file,"\"");
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->items,local_28);
      poVar1 = std::operator<<(poVar1,(string *)pvVar3);
      std::operator<<(poVar1,"\"\n};\n");
    }
    else {
      poVar1 = std::operator<<(file,"\"");
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->items,local_28);
      poVar1 = std::operator<<(poVar1,(string *)pvVar3);
      std::operator<<(poVar1,"\",\n");
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void OutputList::outputToFileAsChar(std::ostream &file, std::string varname) {
        file << "inline constexpr unsigned long " << varname << "_size = " << size() << ";\n";
        file << "\ninline const char *" << varname << "_arr[" << varname << "_size] = {\n";
        for(std::size_t i = 0; i < size(); ++i) {
            if(i > size()-2) {
                file << "\"" << items[i] << "\"\n};\n";
            } else {
                file << "\"" << items[i] << "\",\n";
            }
        }
    }